

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxPow::Emit(FxPow *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint extraout_var;
  uint extraout_var_00;
  int opcode;
  byte bVar5;
  ExpEmit EVar6;
  byte bVar7;
  
  uVar2 = (*((this->super_FxBinary).left)->_vptr_FxExpression[9])();
  pFVar1 = (this->super_FxBinary).right;
  uVar3 = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
  if (((extraout_var & 1) != 0) && ((extraout_var_00 & 1) != 0)) {
    __assert_fail("!op1.Konst || !op2.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xc10,"virtual ExpEmit FxPow::Emit(VMFunctionBuilder *)");
  }
  bVar5 = (byte)(uVar2 >> 0x10);
  if (bVar5 < 4 && (extraout_var & 0x101) == 0) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + ((uint)(CONCAT44(extraout_var,uVar2) >> 0x10) & 3),uVar2 & 0xffff,
               uVar2 >> 0x18);
  }
  bVar7 = (byte)(uVar3 >> 0x10);
  if ((extraout_var_00 & 0x101) == 0) {
    if (3 < bVar7) goto LAB_00526b1f;
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + ((uint)(CONCAT44(extraout_var_00,uVar3) >> 0x10) & 3),
               uVar3 & 0xffff,uVar3 >> 0x18);
  }
  if ((bVar5 == 1) && (bVar7 == 1)) {
    uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 1,1);
    opcode = 0xa6;
    if ((extraout_var & 1) == 0) {
      opcode = 0xa5 - (uint)((extraout_var_00 & 1) == 0);
    }
    VMFunctionBuilder::Emit(build,opcode,uVar4 & 0xffff,uVar2 & 0xffff,uVar3 & 0xffff);
    EVar6._0_4_ = uVar4 & 0xffff | 0x1010000;
    EVar6.Konst = false;
    EVar6.Fixed = false;
    EVar6.Final = false;
    EVar6.Target = false;
    return EVar6;
  }
LAB_00526b1f:
  __assert_fail("op1.RegType == REGT_FLOAT && op2.RegType == REGT_FLOAT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0xc13,"virtual ExpEmit FxPow::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxPow::Emit(VMFunctionBuilder *build)
{
	ExpEmit op1 = left->Emit(build);
	ExpEmit op2 = right->Emit(build);

	// Pow is not commutative, so either side may be constant (but not both).
	assert(!op1.Konst || !op2.Konst);
	op1.Free(build);
	op2.Free(build);
	assert(op1.RegType == REGT_FLOAT && op2.RegType == REGT_FLOAT);
	ExpEmit to(build, REGT_FLOAT);
	build->Emit((op1.Konst ? OP_POWF_KR : op2.Konst ? OP_POWF_RK : OP_POWF_RR),	to.RegNum, op1.RegNum, op2.RegNum);
	return to;
}